

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyShow.c
# Opt level: O3

void Ivy_ManShow(Ivy_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  uint *puVar1;
  ulong uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  FILE *pFVar9;
  long lVar10;
  char *pcVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  char *pcVar14;
  bool bVar15;
  char FileNameDot [200];
  
  Ivy_ManShow::Counter = Ivy_ManShow::Counter + 1;
  sprintf(FileNameDot,"temp%02d.dot");
  pFVar9 = fopen(FileNameDot,"w");
  if (pFVar9 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
  }
  else {
    fclose(pFVar9);
    if (pMan->nObjs[6] + pMan->nObjs[5] < 0xc9) {
      pFVar9 = fopen(FileNameDot,"w");
      if (pFVar9 == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
      }
      else {
        if ((vBold != (Vec_Ptr_t *)0x0) && (0 < vBold->nSize)) {
          lVar10 = 0;
          do {
            puVar1 = (uint *)((long)vBold->pArray[lVar10] + 8);
            *puVar1 = *puVar1 | 0x20;
            lVar10 = lVar10 + 1;
          } while (lVar10 < vBold->nSize);
        }
        uVar8 = Ivy_ManSetLevels(pMan,fHaig);
        uVar13 = uVar8 + 1;
        fprintf(pFVar9,"# %s\n","AIG structure generated by IVY package");
        fputc(10,pFVar9);
        fwrite("digraph AIG {\n",0xe,1,pFVar9);
        fwrite("size = \"7.5,10\";\n",0x11,1,pFVar9);
        fwrite("center = true;\n",0xf,1,pFVar9);
        fwrite("edge [dir = back];\n",0x13,1,pFVar9);
        fputc(10,pFVar9);
        fwrite("{\n",2,1,pFVar9);
        fwrite("  node [shape = plaintext];\n",0x1c,1,pFVar9);
        fwrite("  edge [style = invis];\n",0x18,1,pFVar9);
        fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,pFVar9);
        fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,pFVar9);
        uVar4 = uVar13;
        if ((int)uVar8 < -1) {
          fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,pFVar9);
        }
        else {
          do {
            fprintf(pFVar9,"  Level%d",(ulong)uVar4);
            fwrite(" [label = ",10,1,pFVar9);
            fputc(0x22,pFVar9);
            fputc(0x22,pFVar9);
            fwrite("];\n",3,1,pFVar9);
            bVar15 = uVar4 != 0;
            uVar4 = uVar4 - 1;
          } while (bVar15);
          fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,pFVar9);
          fprintf(pFVar9,"  Level%d",(ulong)uVar13);
          uVar7 = uVar8;
          uVar4 = uVar13;
          while (uVar5 = uVar7, uVar4 != 0) {
            fwrite(" ->",3,1,pFVar9);
            fprintf(pFVar9,"  Level%d",(ulong)uVar5);
            uVar7 = uVar5 - 1;
            uVar4 = uVar5;
          }
          fputc(0x3b,pFVar9);
        }
        fputc(10,pFVar9);
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        fwrite("{\n",2,1,pFVar9);
        fwrite("  rank = same;\n",0xf,1,pFVar9);
        fwrite("  LevelTitle1;\n",0xf,1,pFVar9);
        fwrite("  title1 [shape=plaintext,\n",0x1b,1,pFVar9);
        fwrite("          fontsize=20,\n",0x17,1,pFVar9);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar9);
        fwrite("          label=\"",0x11,1,pFVar9);
        fputs("AIG structure visualized by ABC",pFVar9);
        fwrite("\\n",2,1,pFVar9);
        fprintf(pFVar9,"Benchmark \\\"%s\\\". ","aig");
        pcVar11 = Extra_TimeStamp();
        fprintf(pFVar9,"Time was %s. ",pcVar11);
        fwrite("\"\n",2,1,pFVar9);
        fwrite("         ];\n",0xc,1,pFVar9);
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        fwrite("{\n",2,1,pFVar9);
        fwrite("  rank = same;\n",0xf,1,pFVar9);
        fwrite("  LevelTitle2;\n",0xf,1,pFVar9);
        fwrite("  title2 [shape=plaintext,\n",0x1b,1,pFVar9);
        fwrite("          fontsize=18,\n",0x17,1,pFVar9);
        fwrite("          fontname = \"Times-Roman\",\n",0x24,1,pFVar9);
        fwrite("          label=\"",0x11,1,pFVar9);
        fprintf(pFVar9,"The set contains %d logic nodes and spans %d levels.",
                (ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]),(ulong)uVar13);
        fwrite("\\n",2,1,pFVar9);
        fwrite("\"\n",2,1,pFVar9);
        fwrite("         ];\n",0xc,1,pFVar9);
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        fwrite("{\n",2,1,pFVar9);
        fwrite("  rank = same;\n",0xf,1,pFVar9);
        fprintf(pFVar9,"  Level%d;\n",(ulong)uVar13);
        pVVar12 = pMan->vObjs;
        if (0 < pVVar12->nSize) {
          lVar10 = 0;
          do {
            puVar1 = (uint *)pVVar12->pArray[lVar10];
            if ((puVar1 != (uint *)0x0) &&
               ((uVar13 = puVar1[2] & 0xf, uVar13 == 4 || (uVar13 == 2)))) {
              if ((fHaig == 0) && (uVar2 = *(ulong *)(puVar1 + 0x12), uVar2 != 0)) {
                pcVar11 = "";
                if (uVar13 == 4) {
                  pcVar11 = "_in";
                }
                pcVar14 = "\'";
                if ((uVar2 & 1) == 0) {
                  pcVar14 = "";
                }
                fprintf(pFVar9,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar1,pcVar11,
                        (ulong)*puVar1,pcVar11,(ulong)*(uint *)(uVar2 & 0xfffffffffffffffe),pcVar14)
                ;
              }
              else {
                pcVar11 = "";
                if (uVar13 == 4) {
                  pcVar11 = "_in";
                }
                fprintf(pFVar9,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar1,pcVar11,(ulong)*puVar1,
                        pcVar11);
              }
              pcVar11 = "invtriangle";
              if ((puVar1[2] & 0xf) == 4) {
                pcVar11 = "box";
              }
              fprintf(pFVar9,", shape = %s",pcVar11);
              fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar9);
              fwrite("];\n",3,1,pFVar9);
              pVVar12 = pMan->vObjs;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar12->nSize);
        }
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        if (0 < (int)uVar8) {
          do {
            fwrite("{\n",2,1,pFVar9);
            fwrite("  rank = same;\n",0xf,1,pFVar9);
            fprintf(pFVar9,"  Level%d;\n",(ulong)uVar8);
            pVVar12 = pMan->vObjs;
            if (0 < pVVar12->nSize) {
              lVar10 = 0;
              do {
                puVar1 = (uint *)pVVar12->pArray[lVar10];
                if ((puVar1 != (uint *)0x0) && (puVar1[2] >> 0xb == uVar8)) {
                  if ((fHaig == 0) && (uVar2 = *(ulong *)(puVar1 + 0x12), uVar2 != 0)) {
                    pcVar11 = "\'";
                    if ((uVar2 & 1) == 0) {
                      pcVar11 = "";
                    }
                    fprintf(pFVar9,"  Node%d [label = \"%d(%d%s)\"",(ulong)*puVar1,(ulong)*puVar1,
                            (ulong)*(uint *)(uVar2 & 0xfffffffffffffffe),pcVar11);
                  }
                  else {
                    fprintf(pFVar9,"  Node%d [label = \"%d\"",(ulong)*puVar1);
                  }
                  fwrite(", shape = ellipse",0x11,1,pFVar9);
                  if ((vBold != (Vec_Ptr_t *)0x0) && ((puVar1[2] & 0x20) != 0)) {
                    fwrite(", style = filled",0x10,1,pFVar9);
                  }
                  fwrite("];\n",3,1,pFVar9);
                  pVVar12 = pMan->vObjs;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 < pVVar12->nSize);
            }
            fputc(0x7d,pFVar9);
            fputc(10,pFVar9);
            fputc(10,pFVar9);
            bVar15 = 1 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar15);
        }
        fwrite("{\n",2,1,pFVar9);
        fwrite("  rank = same;\n",0xf,1,pFVar9);
        fprintf(pFVar9,"  Level%d;\n",0);
        if (0 < pMan->pConst1->nRefs) {
          fprintf(pFVar9,"  Node%d [label = \"Const1\"",(ulong)(uint)pMan->pConst1->Id);
          fwrite(", shape = ellipse",0x11,1,pFVar9);
          fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar9);
          fwrite("];\n",3,1,pFVar9);
        }
        pVVar12 = pMan->vObjs;
        if (0 < pVVar12->nSize) {
          lVar10 = 0;
          do {
            puVar1 = (uint *)pVVar12->pArray[lVar10];
            if ((puVar1 != (uint *)0x0) &&
               ((uVar13 = puVar1[2] & 0xf, uVar13 == 4 || (uVar13 == 1)))) {
              if ((fHaig == 0) && (uVar2 = *(ulong *)(puVar1 + 0x12), uVar2 != 0)) {
                pcVar11 = "";
                if (uVar13 == 4) {
                  pcVar11 = "_out";
                }
                pcVar14 = "\'";
                if ((uVar2 & 1) == 0) {
                  pcVar14 = "";
                }
                fprintf(pFVar9,"  Node%d%s [label = \"%d%s(%d%s)\"",(ulong)*puVar1,pcVar11,
                        (ulong)*puVar1,pcVar11,(ulong)*(uint *)(uVar2 & 0xfffffffffffffffe),pcVar14)
                ;
              }
              else {
                pcVar11 = "";
                if (uVar13 == 4) {
                  pcVar11 = "_out";
                }
                fprintf(pFVar9,"  Node%d%s [label = \"%d%s\"",(ulong)*puVar1,pcVar11,(ulong)*puVar1,
                        pcVar11);
              }
              pcVar11 = "triangle";
              if ((puVar1[2] & 0xf) == 4) {
                pcVar11 = "box";
              }
              fprintf(pFVar9,", shape = %s",pcVar11);
              fwrite(", color = coral, fillcolor = coral",0x22,1,pFVar9);
              fwrite("];\n",3,1,pFVar9);
              pVVar12 = pMan->vObjs;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar12->nSize);
        }
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        fwrite("title1 -> title2 [style = invis];\n",0x22,1,pFVar9);
        pVVar12 = pMan->vObjs;
        if (0 < pVVar12->nSize) {
          lVar10 = 0;
          do {
            puVar1 = (uint *)pVVar12->pArray[lVar10];
            if ((puVar1 != (uint *)0x0) &&
               ((uVar13 = puVar1[2] & 0xf, uVar13 == 4 || (uVar13 == 2)))) {
              pcVar11 = "_in";
              if (uVar13 != 4) {
                pcVar11 = "";
              }
              fprintf(pFVar9,"title2 -> Node%d%s [style = invis];\n",(ulong)*puVar1,pcVar11);
              pVVar12 = pMan->vObjs;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar12->nSize);
          if (0 < pVVar12->nSize) {
            pcVar11 = "dotted";
            lVar10 = 0;
            do {
              puVar1 = (uint *)pVVar12->pArray[lVar10];
              if ((puVar1 != (uint *)0x0) &&
                 ((uVar13 = puVar1[2] & 0xf, 0xfffffffd < uVar13 - 7 ||
                  ((uVar13 < 8 && ((0x94U >> uVar13 & 1) != 0)))))) {
                pcVar14 = "";
                if (uVar13 == 4) {
                  pcVar14 = "_in";
                }
                fprintf(pFVar9,"Node%d%s",(ulong)*puVar1,pcVar14);
                fwrite(" -> ",4,1,pFVar9);
                pcVar14 = "";
                if ((((uint *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe))[2] & 0xf) == 4) {
                  pcVar14 = "_out";
                }
                fprintf(pFVar9,"Node%d%s",
                        (ulong)*(uint *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe),pcVar14);
                fwrite(" [",2,1,pFVar9);
                pcVar14 = pcVar11;
                if ((puVar1[4] & 1) == 0) {
                  pcVar14 = "bold";
                }
                fprintf(pFVar9,"style = %s",pcVar14);
                fputc(0x5d,pFVar9);
                fwrite(";\n",2,1,pFVar9);
                if (0xfffffffd < (puVar1[2] & 0xf) - 7) {
                  fprintf(pFVar9,"Node%d",(ulong)*puVar1);
                  fwrite(" -> ",4,1,pFVar9);
                  pcVar14 = "";
                  if ((((uint *)(*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))[2] & 0xf) == 4) {
                    pcVar14 = "_out";
                  }
                  fprintf(pFVar9,"Node%d%s",
                          (ulong)*(uint *)(*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe),pcVar14);
                  fwrite(" [",2,1,pFVar9);
                  pcVar14 = pcVar11;
                  if ((puVar1[6] & 1) == 0) {
                    pcVar14 = "bold";
                  }
                  fprintf(pFVar9,"style = %s",pcVar14);
                  fputc(0x5d,pFVar9);
                  fwrite(";\n",2,1,pFVar9);
                  if (((fHaig != 0) && (puVar3 = *(uint **)(puVar1 + 0x12), puVar3 != (uint *)0x0))
                     && (puVar6 = puVar1, 0 < (int)puVar1[3])) {
                    for (; puVar3 != puVar1;
                        puVar3 = (uint *)(*(ulong *)(puVar3 + 0x12) & 0xfffffffffffffffe)) {
                      fprintf(pFVar9,"Node%d",(ulong)*puVar6);
                      fwrite(" -> ",4,1,pFVar9);
                      fprintf(pFVar9,"Node%d",(ulong)*puVar3);
                      pcVar14 = pcVar11;
                      if ((puVar3[0x12] & 1) == 0) {
                        pcVar14 = "bold";
                      }
                      fprintf(pFVar9," [style = %s]",pcVar14);
                      fwrite(";\n",2,1,pFVar9);
                      puVar6 = puVar3;
                    }
                    fprintf(pFVar9,"Node%d",(ulong)*puVar6);
                    fwrite(" -> ",4,1,pFVar9);
                    fprintf(pFVar9,"Node%d",(ulong)*puVar1);
                    pcVar14 = pcVar11;
                    if ((puVar6[0x12] & 1) == 0) {
                      pcVar14 = "bold";
                    }
                    fprintf(pFVar9," [style = %s]",pcVar14);
                    fwrite(";\n",2,1,pFVar9);
                  }
                }
              }
              lVar10 = lVar10 + 1;
              pVVar12 = pMan->vObjs;
            } while (lVar10 < pVVar12->nSize);
          }
        }
        fputc(0x7d,pFVar9);
        fputc(10,pFVar9);
        fputc(10,pFVar9);
        fclose(pFVar9);
        if ((vBold != (Vec_Ptr_t *)0x0) && (0 < vBold->nSize)) {
          lVar10 = 0;
          do {
            puVar1 = (uint *)((long)vBold->pArray[lVar10] + 8);
            *puVar1 = *puVar1 & 0xffffffdf;
            lVar10 = lVar10 + 1;
          } while (lVar10 < vBold->nSize);
        }
      }
    }
    else {
      fwrite("Cannot visualize AIG with more than 200 nodes.\n",0x2f,1,_stdout);
    }
    Abc_ShowFile(FileNameDot);
  }
  return;
}

Assistant:

void Ivy_ManShow( Ivy_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    static int Counter = 0;
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
//    Ivy_ShowGetFileName( pMan->pName, FileNameDot );
    sprintf( FileNameDot, "temp%02d.dot", Counter++ );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Ivy_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}